

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::AttachedComment::~AttachedComment(AttachedComment *this)

{
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__AttachedComment_0012ad58;
  std::__cxx11::string::~string((string *)&this->str);
  return;
}

Assistant:

explicit AttachedComment(std::string str)
      : IRInst(InstType::AttachedComment), str(std::move(str)) {}